

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O1

void __thiscall MmapReader::file_helper::~file_helper(file_helper *this)

{
  pointer pcVar1;
  __off_t __length;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FileReader w;
  FileReader FStack_48;
  
  if (this->trunc == true) {
    FileReader::FileReader(&FStack_48,this);
    FileReader::truncate(&FStack_48,(char *)this->tsize,__length);
    FileReader::~FileReader(&FStack_48);
  }
  pcVar1 = (this->fname)._M_dataplus._M_p;
  paVar2 = &(this->fname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~file_helper()
        {
            if (trunc) {
                FileReader w(fname, FileReader::readwrite);
                w.truncate(tsize);
            }
        }